

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall google::protobuf::RepeatedField<float>::RemoveLast(RepeatedField<float> *this)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  LongSooRep *pLVar6;
  long *plVar7;
  long *__src;
  string *psVar8;
  LongSooRep *pLVar9;
  bool bVar10;
  LongSooRep LStack_a0;
  LongSooRep *pLStack_90;
  LongSooRep LStack_68;
  RepeatedField<float> *pRStack_58;
  LongSooRep local_30;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  iVar3 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"old_size > 0");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 == (string *)0x0) {
    bVar10 = (uVar1 & 4) == 0;
    elements(this,bVar10);
    iVar4 = internal::SooRep::size(&this->soo_rep_,bVar10);
    if ((iVar4 != iVar3 + -1) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  pLVar6 = &local_30;
  RemoveLast();
  uVar1 = pLVar6->elements_int;
  pRStack_58 = this;
  iVar3 = internal::SooRep::size((SooRep *)pLVar6,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"old_size > 0");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 == (string *)0x0) {
    bVar10 = (uVar1 & 4) == 0;
    RepeatedField<double>::elements((RepeatedField<double> *)pLVar6,bVar10);
    iVar4 = internal::SooRep::size((SooRep *)pLVar6,bVar10);
    if ((iVar4 != iVar3 + -1) && ((pLVar6->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar6);
    }
    RepeatedField<double>::set_size((RepeatedField<double> *)pLVar6,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  pLVar9 = &LStack_68;
  RepeatedField<double>::RemoveLast();
  uVar1 = pLVar9->elements_int;
  pLStack_90 = pLVar6;
  iVar3 = internal::SooRep::size((SooRep *)pLVar9,(uVar1 & 4) == 0);
  if (iVar3 < 1) {
    pLVar6 = (LongSooRep *)
             absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)iVar3,0,"old_size > 0");
  }
  else {
    pLVar6 = (LongSooRep *)0x0;
  }
  if (pLVar6 == (LongSooRep *)0x0) {
    bVar10 = (uVar1 & 4) == 0;
    RepeatedField<bool>::elements((RepeatedField<bool> *)pLVar9,bVar10);
    iVar4 = internal::SooRep::size((SooRep *)pLVar9,bVar10);
    if ((iVar4 != iVar3 + -1) && ((pLVar9->elements_int & 4) != 0)) {
      internal::LongSooRep::elements(pLVar9);
    }
    RepeatedField<bool>::set_size((RepeatedField<bool> *)pLVar9,(uVar1 & 4) == 0,iVar3 + -1);
    return;
  }
  pLVar9 = &LStack_a0;
  RepeatedField<bool>::RemoveLast();
  if (pLVar6 == pLVar9) {
    psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (pLVar6,pLVar9,"&other != this");
  }
  else {
    psVar8 = (string *)0x0;
  }
  if (psVar8 == (string *)0x0) {
    uVar1 = pLVar6->elements_int;
    iVar3 = internal::SooRep::size((SooRep *)pLVar6,(uVar1 & 4) == 0);
    if (iVar3 != 0) {
      iVar4 = internal::SooRep::size((SooRep *)pLVar9,(pLVar9->elements_int & 4) == 0);
      iVar4 = iVar4 + iVar3;
      RepeatedField<long>::Reserve((RepeatedField<long> *)pLVar9,iVar4);
      uVar2 = pLVar9->elements_int;
      bVar10 = (uVar2 & 4) == 0;
      plVar7 = RepeatedField<long>::elements((RepeatedField<long> *)pLVar9,bVar10);
      iVar5 = internal::SooRep::size((SooRep *)pLVar9,bVar10);
      if ((iVar5 != iVar4) && ((pLVar9->elements_int & 4) != 0)) {
        internal::LongSooRep::elements(pLVar9);
      }
      RepeatedField<long>::set_size((RepeatedField<long> *)pLVar9,(uVar2 & 4) == 0,iVar4);
      __src = RepeatedField<long>::elements((RepeatedField<long> *)pLVar6,(uVar1 & 4) == 0);
      memcpy(plVar7 + iVar5,__src,(long)iVar3 << 3);
      return;
    }
    return;
  }
  RepeatedField<long>::MergeFrom();
}

Assistant:

inline void RepeatedField<Element>::RemoveLast() {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  ABSL_DCHECK_GT(old_size, 0);
  elements(is_soo)[old_size - 1].~Element();
  ExchangeCurrentSize(is_soo, old_size - 1);
}